

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * google::protobuf::anon_unknown_24::ValueOutOfRange<int>
                   (string_view type_name,string_view option_name)

{
  string *psVar1;
  string *in_RDI;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined1 *local_20;
  code *local_18;
  undefined1 *local_10;
  code *local_8;
  
  local_20 = local_50;
  local_10 = local_60;
  local_40 = 0x80000000;
  local_38 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
  local_30 = 0x7fffffff;
  local_28 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
  local_18 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_8 = absl::lts_20250127::str_format_internal::FormatArgImpl::
            Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  format.size_ = (size_t)&local_40;
  format.data_ = (void *)0x31;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x4;
  psVar1 = absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
                     (in_RDI,(str_format_internal *)
                             "Value out of range, %d to %d, for %s option \"%s\".",format,args);
  return psVar1;
}

Assistant:

std::string ValueOutOfRange(absl::string_view type_name,
                            absl::string_view option_name) {
  return absl::StrFormat("Value out of range, %d to %d, for %s option \"%s\".",
                         std::numeric_limits<T>::min(),
                         std::numeric_limits<T>::max(), type_name, option_name);
}